

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlRelaxNGFreeValidCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  PyObject *pPVar3;
  xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
  PyObject *pyobj_ctxt;
  undefined8 *local_20;
  undefined *local_18;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlRelaxNGFreeValidCtxt",&local_18);
  if (iVar1 != 0) {
    if (local_18 == &_Py_NoneStruct) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(undefined8 *)(local_18 + 0x10);
    }
    iVar1 = xmlRelaxNGGetValidErrors(uVar2,0,0,&local_20);
    if (local_20 != (undefined8 *)0x0 && iVar1 == 0) {
      _Py_XDECREF((PyObject *)local_20[1]);
      _Py_XDECREF((PyObject *)*local_20);
      _Py_XDECREF((PyObject *)local_20[2]);
      (*_xmlFree)(local_20);
    }
    xmlRelaxNGFreeValidCtxt(uVar2);
    pPVar3 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlRelaxNGFreeValidCtxt(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlRelaxNGValidCtxtPtr ctxt;
    xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlRelaxNGFreeValidCtxt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlRelaxNGValidCtxtPtr) PyrelaxNgValidCtxt_Get(pyobj_ctxt);

    if (xmlRelaxNGGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == 0)
    {
        if (pyCtxt != NULL)
        {
            Py_XDECREF(pyCtxt->error);
            Py_XDECREF(pyCtxt->warn);
            Py_XDECREF(pyCtxt->arg);
            xmlFree(pyCtxt);
        }
    }
    
    xmlRelaxNGFreeValidCtxt(ctxt);
    Py_INCREF(Py_None);
    return(Py_None);
}